

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStg.c
# Opt level: O0

Vec_Vec_t * Gia_ManAssignCodes(int kHot,int nStates,int *pnBits)

{
  int iVar1;
  int iVar2;
  Vec_Vec_t *p;
  int local_44;
  int local_40;
  int nBits;
  int i5;
  int i4;
  int i3;
  int i2;
  int i1;
  int s;
  Vec_Vec_t *vCodes;
  int *pnBits_local;
  int nStates_local;
  int kHot_local;
  
  if (nStates < 1) {
    __assert_fail("nStates > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                  ,0x71,"Vec_Vec_t *Gia_ManAssignCodes(int, int, int *)");
  }
  if ((0 < kHot) && (kHot < 6)) {
    p = Vec_VecStart(nStates);
    *pnBits = -1;
    if (kHot == 1) {
      for (i3 = 0; i3 < nStates; i3 = i3 + 1) {
        Vec_VecPushInt(p,i3,i3);
      }
      *pnBits = nStates;
      return p;
    }
    if (kHot == 2) {
      for (local_44 = 2; (local_44 < 1000000000 && ((local_44 * (local_44 + -1)) / 2 < nStates));
          local_44 = local_44 + 1) {
      }
      *pnBits = local_44;
      i2 = 0;
      for (i3 = 0; i4 = i3, i3 < local_44; i3 = i3 + 1) {
        while (i4 = i4 + 1, i4 < local_44) {
          Vec_VecPushInt(p,i2,i3);
          Vec_VecPushInt(p,i2,i4);
          i2 = i2 + 1;
          if (i2 == nStates) {
            return p;
          }
        }
      }
    }
    if (kHot == 3) {
      for (local_44 = 3;
          (local_44 < 1000000000 && ((local_44 * (local_44 + -1) * (local_44 + -2)) / 6 < nStates));
          local_44 = local_44 + 1) {
      }
      *pnBits = local_44;
      i2 = 0;
      for (i3 = 0; iVar1 = i3, i3 < local_44; i3 = i3 + 1) {
        while (i4 = iVar1 + 1, i4 < local_44) {
          for (i5 = iVar1 + 2; iVar1 = i4, i5 < local_44; i5 = i5 + 1) {
            Vec_VecPushInt(p,i2,i3);
            Vec_VecPushInt(p,i2,i4);
            Vec_VecPushInt(p,i2,i5);
            i2 = i2 + 1;
            if (i2 == nStates) {
              return p;
            }
          }
        }
      }
    }
    if (kHot == 4) {
      for (local_44 = 4;
          (local_44 < 1000000000 &&
          ((local_44 * (local_44 + -1) * (local_44 + -2) * (local_44 + -3)) / 0x18 < nStates));
          local_44 = local_44 + 1) {
      }
      *pnBits = local_44;
      i2 = 0;
      for (i3 = 0; iVar1 = i3, i3 < local_44; i3 = i3 + 1) {
        while (i4 = iVar1 + 1, i4 < local_44) {
          for (i5 = iVar1 + 2; iVar1 = i4, nBits = i5, i5 < local_44; i5 = i5 + 1) {
            while (nBits = nBits + 1, nBits < local_44) {
              Vec_VecPushInt(p,i2,i3);
              Vec_VecPushInt(p,i2,i4);
              Vec_VecPushInt(p,i2,i5);
              Vec_VecPushInt(p,i2,nBits);
              i2 = i2 + 1;
              if (i2 == nStates) {
                return p;
              }
            }
          }
        }
      }
    }
    if (kHot == 5) {
      for (local_44 = 5;
          (local_44 < 1000000000 &&
          ((local_44 * (local_44 + -1) * (local_44 + -2) * (local_44 + -3) * (local_44 + -4)) / 0x78
           < nStates)); local_44 = local_44 + 1) {
      }
      *pnBits = local_44;
      i2 = 0;
      for (i3 = 0; iVar1 = i3, i3 < local_44; i3 = i3 + 1) {
        while (i4 = iVar1 + 1, i4 < local_44) {
          for (i5 = iVar1 + 2; iVar1 = i4, iVar2 = i5, i5 < local_44; i5 = i5 + 1) {
            while (nBits = iVar2 + 1, nBits < local_44) {
              for (local_40 = iVar2 + 2; iVar2 = nBits, local_40 < local_44; local_40 = local_40 + 1
                  ) {
                Vec_VecPushInt(p,i2,i3);
                Vec_VecPushInt(p,i2,i4);
                Vec_VecPushInt(p,i2,i5);
                Vec_VecPushInt(p,i2,nBits);
                Vec_VecPushInt(p,i2,local_40);
                i2 = i2 + 1;
                if (i2 == nStates) {
                  return p;
                }
              }
            }
          }
        }
      }
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                  ,200,"Vec_Vec_t *Gia_ManAssignCodes(int, int, int *)");
  }
  __assert_fail("kHot >= 1 && kHot <= 5",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                ,0x72,"Vec_Vec_t *Gia_ManAssignCodes(int, int, int *)");
}

Assistant:

Vec_Vec_t * Gia_ManAssignCodes( int kHot, int nStates, int * pnBits )
{
    Vec_Vec_t * vCodes;
    int s, i1, i2, i3, i4, i5, nBits;
    assert( nStates > 0 );
    assert( kHot >= 1 && kHot <= 5 );
    vCodes = Vec_VecStart( nStates );
    *pnBits = -1;
    if ( kHot == 1 )
    {
        for ( i1 = 0; i1 < nStates; i1++ )
            Vec_VecPushInt( vCodes, i1, i1 );
        *pnBits = nStates;
        return vCodes;
    }
    if ( kHot == 2 )
    {
        for ( nBits = kHot; nBits < ABC_INFINITY; nBits++ )
            if ( nBits * (nBits-1) / 2 >= nStates )
                break;
        *pnBits = nBits;
        s = 0;
        for ( i1 = 0; i1 < nBits; i1++ )
        for ( i2 = i1 + 1; i2 < nBits; i2++ )
        {
            Vec_VecPushInt( vCodes, s, i1 );
            Vec_VecPushInt( vCodes, s, i2 );
            if ( ++s == nStates )
                return vCodes;
        }
    }
    if ( kHot == 3 )
    {
        for ( nBits = kHot; nBits < ABC_INFINITY; nBits++ )
            if ( nBits * (nBits-1) * (nBits-2) / 6 >= nStates )
                break;       
        *pnBits = nBits;
        s = 0;
        for ( i1 = 0; i1 < nBits; i1++ )
        for ( i2 = i1 + 1; i2 < nBits; i2++ )
        for ( i3 = i2 + 1; i3 < nBits; i3++ )
        {
            Vec_VecPushInt( vCodes, s, i1 );
            Vec_VecPushInt( vCodes, s, i2 );
            Vec_VecPushInt( vCodes, s, i3 );
            if ( ++s == nStates )
                return vCodes;
        }
    }
    if ( kHot == 4 )
    {
        for ( nBits = kHot; nBits < ABC_INFINITY; nBits++ )
            if ( nBits * (nBits-1) * (nBits-2) * (nBits-3) / 24 >= nStates )
                break;       
        *pnBits = nBits;
        s = 0;
        for ( i1 = 0; i1 < nBits; i1++ )
        for ( i2 = i1 + 1; i2 < nBits; i2++ )
        for ( i3 = i2 + 1; i3 < nBits; i3++ )
        for ( i4 = i3 + 1; i4 < nBits; i4++ )
        {
            Vec_VecPushInt( vCodes, s, i1 );
            Vec_VecPushInt( vCodes, s, i2 );
            Vec_VecPushInt( vCodes, s, i3 );
            Vec_VecPushInt( vCodes, s, i4 );
            if ( ++s == nStates )
                return vCodes;
        }
    }
    if ( kHot == 5 )
    {
        for ( nBits = kHot; nBits < ABC_INFINITY; nBits++ )
            if ( nBits * (nBits-1) * (nBits-2) * (nBits-3) * (nBits-4) / 120 >= nStates )
                break;       
        *pnBits = nBits;
        s = 0;
        for ( i1 = 0; i1 < nBits; i1++ )
        for ( i2 = i1 + 1; i2 < nBits; i2++ )
        for ( i3 = i2 + 1; i3 < nBits; i3++ )
        for ( i4 = i3 + 1; i4 < nBits; i4++ )
        for ( i5 = i4 + 1; i5 < nBits; i5++ )
        {
            Vec_VecPushInt( vCodes, s, i1 );
            Vec_VecPushInt( vCodes, s, i2 );
            Vec_VecPushInt( vCodes, s, i3 );
            Vec_VecPushInt( vCodes, s, i4 );
            Vec_VecPushInt( vCodes, s, i5 );
            if ( ++s == nStates )
                return vCodes;
        }
    }
    assert( 0 );
    return NULL;
}